

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDOMWrapCloneNode(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  xmlDocPtr val_01;
  xmlNodePtr val_02;
  xmlDocPtr val_03;
  xmlNodePtr val_04;
  uint local_84;
  int n_options;
  int options;
  int n_deep;
  int deep;
  int n_destParent;
  xmlNodePtr destParent;
  int n_destDoc;
  xmlDocPtr destDoc;
  int n_resNode;
  xmlNodePtr *resNode;
  int n_node;
  xmlNodePtr node;
  int n_sourceDoc;
  xmlDocPtr sourceDoc;
  int n_ctxt;
  xmlDOMWrapCtxtPtr_conflict ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (sourceDoc._4_4_ = 0; (int)sourceDoc._4_4_ < 1; sourceDoc._4_4_ = sourceDoc._4_4_ + 1) {
    for (node._4_4_ = 0; (int)node._4_4_ < 4; node._4_4_ = node._4_4_ + 1) {
      for (resNode._4_4_ = 0; (int)resNode._4_4_ < 3; resNode._4_4_ = resNode._4_4_ + 1) {
        for (destDoc._4_4_ = 0; (int)destDoc._4_4_ < 1; destDoc._4_4_ = destDoc._4_4_ + 1) {
          for (destParent._4_4_ = 0; (int)destParent._4_4_ < 4;
              destParent._4_4_ = destParent._4_4_ + 1) {
            for (n_deep = 0; n_deep < 3; n_deep = n_deep + 1) {
              for (n_options = 0; n_options < 4; n_options = n_options + 1) {
                for (local_84 = 0; (int)local_84 < 4; local_84 = local_84 + 1) {
                  iVar1 = xmlMemBlocks();
                  val_01 = gen_xmlDocPtr(node._4_4_,1);
                  val_02 = gen_xmlNodePtr(resNode._4_4_,2);
                  val_03 = gen_xmlDocPtr(destParent._4_4_,4);
                  val_04 = gen_xmlNodePtr(n_deep,5);
                  iVar2 = gen_int(n_options,6);
                  val = gen_int(local_84,7);
                  val_00 = xmlDOMWrapCloneNode(0,val_01,val_02,0,val_03,val_04,iVar2,val);
                  desret_int(val_00);
                  call_tests = call_tests + 1;
                  des_xmlDocPtr(node._4_4_,val_01,1);
                  des_xmlNodePtr(resNode._4_4_,val_02,2);
                  des_xmlDocPtr(destParent._4_4_,val_03,4);
                  des_xmlNodePtr(n_deep,val_04,5);
                  des_int(n_options,iVar2,6);
                  des_int(local_84,val,7);
                  xmlResetLastError();
                  iVar2 = xmlMemBlocks();
                  if (iVar1 != iVar2) {
                    iVar2 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlDOMWrapCloneNode",
                           (ulong)(uint)(iVar2 - iVar1));
                    ret_val = ret_val + 1;
                    printf(" %d",(ulong)sourceDoc._4_4_);
                    printf(" %d",(ulong)node._4_4_);
                    printf(" %d",(ulong)resNode._4_4_);
                    printf(" %d",(ulong)destDoc._4_4_);
                    printf(" %d",(ulong)destParent._4_4_);
                    printf(" %d",(ulong)(uint)n_deep);
                    printf(" %d",(ulong)(uint)n_options);
                    printf(" %d",(ulong)local_84);
                    printf("\n");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlDOMWrapCloneNode(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlDOMWrapCtxtPtr ctxt; /* the optional context for custom processing */
    int n_ctxt;
    xmlDocPtr sourceDoc; /* the optional sourceDoc */
    int n_sourceDoc;
    xmlNodePtr node; /* the node to start with */
    int n_node;
    xmlNodePtr * resNode; /* the clone of the given @node */
    int n_resNode;
    xmlDocPtr destDoc; /* the destination doc */
    int n_destDoc;
    xmlNodePtr destParent; /* the optional new parent of @node in @destDoc */
    int n_destParent;
    int deep; /* descend into child if set */
    int n_deep;
    int options; /* option flags */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlDOMWrapCtxtPtr;n_ctxt++) {
    for (n_sourceDoc = 0;n_sourceDoc < gen_nb_xmlDocPtr;n_sourceDoc++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_resNode = 0;n_resNode < gen_nb_xmlNodePtr_ptr;n_resNode++) {
    for (n_destDoc = 0;n_destDoc < gen_nb_xmlDocPtr;n_destDoc++) {
    for (n_destParent = 0;n_destParent < gen_nb_xmlNodePtr;n_destParent++) {
    for (n_deep = 0;n_deep < gen_nb_int;n_deep++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlDOMWrapCtxtPtr(n_ctxt, 0);
        sourceDoc = gen_xmlDocPtr(n_sourceDoc, 1);
        node = gen_xmlNodePtr(n_node, 2);
        resNode = gen_xmlNodePtr_ptr(n_resNode, 3);
        destDoc = gen_xmlDocPtr(n_destDoc, 4);
        destParent = gen_xmlNodePtr(n_destParent, 5);
        deep = gen_int(n_deep, 6);
        options = gen_int(n_options, 7);

        ret_val = xmlDOMWrapCloneNode(ctxt, sourceDoc, node, resNode, destDoc, destParent, deep, options);
        desret_int(ret_val);
        call_tests++;
        des_xmlDOMWrapCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_sourceDoc, sourceDoc, 1);
        des_xmlNodePtr(n_node, node, 2);
        des_xmlNodePtr_ptr(n_resNode, resNode, 3);
        des_xmlDocPtr(n_destDoc, destDoc, 4);
        des_xmlNodePtr(n_destParent, destParent, 5);
        des_int(n_deep, deep, 6);
        des_int(n_options, options, 7);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDOMWrapCloneNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_sourceDoc);
            printf(" %d", n_node);
            printf(" %d", n_resNode);
            printf(" %d", n_destDoc);
            printf(" %d", n_destParent);
            printf(" %d", n_deep);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}